

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O3

void __thiscall BpTree<float>::Block2Node(BpTree<float> *this,int BlockNum,IndexNode<float> *Node)

{
  int iVar1;
  size_t sVar2;
  char cVar3;
  char *pcVar4;
  long lVar5;
  char buf [100];
  stringstream temp_1;
  stringstream temp;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  stringstream local_340 [16];
  ostream local_330 [112];
  ios_base aiStack_2c0 [264];
  stringstream local_1b8 [128];
  ios_base aiStack_138 [264];
  
  pcVar4 = blocks.buffer[BlockNum].data + 1;
  cVar3 = blocks.buffer[BlockNum].data[0];
  Node->NodeState = cVar3;
  iVar1 = this->N;
  if (1 < iVar1) {
    lVar5 = 0;
    do {
      std::__cxx11::stringstream::stringstream(local_1b8);
      (Node->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar5] = *pcVar4;
      if ((Node->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar5] == '1') {
        if (this->Data_Type == '2') {
          std::__cxx11::stringstream::stringstream(local_340);
          local_3a8 = *(undefined8 *)(pcVar4 + 1);
          uStack_3a0 = *(undefined8 *)(pcVar4 + 9);
          local_398 = *(undefined8 *)(pcVar4 + 0x11);
          uStack_390 = *(undefined8 *)(pcVar4 + 0x19);
          sVar2 = strlen((char *)&local_3a8);
          std::__ostream_insert<char,std::char_traits<char>>(local_330,(char *)&local_3a8,sVar2);
          std::istream::_M_extract<float>((float *)local_340);
          std::__cxx11::stringstream::~stringstream(local_340);
          std::ios_base::~ios_base(aiStack_2c0);
        }
        else {
          (Node->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[lVar5] = *(float *)(pcVar4 + 1);
        }
      }
      pcVar4 = pcVar4 + 5;
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(aiStack_138);
      lVar5 = lVar5 + 1;
      iVar1 = this->N;
    } while (lVar5 < (long)iVar1 + -1);
    cVar3 = Node->NodeState;
  }
  if (1 < iVar1 && cVar3 == '1') {
    lVar5 = 0;
    do {
      (Node->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar5].BlockNum = *(int *)pcVar4;
      pcVar4 = pcVar4 + 4;
      lVar5 = lVar5 + 1;
      iVar1 = this->N;
    } while (lVar5 < (long)iVar1 + -1);
  }
  if (0 < iVar1) {
    lVar5 = 0;
    do {
      (Node->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar5].FileOff = *(int *)pcVar4;
      pcVar4 = pcVar4 + 4;
      lVar5 = lVar5 + 1;
    } while (lVar5 < this->N);
  }
  (Node->parent).FileOff = *(int *)pcVar4;
  return;
}

Assistant:

void BpTree<K>::Block2Node(int BlockNum, IndexNode<K>& Node) {
	int i;
	char buf[100];
	char* p = blocks.buffer[BlockNum].data;
	memcpy(&Node.NodeState, p, sizeof(char));
	p += sizeof(char);
	for (i = 0; i < N - 1; i++) {
		stringstream temp;
		memcpy(&Node.v[i], p, sizeof(char));
		p += sizeof(char);
		if (Node.v[i] == '1') {
			if (this->Data_Type == STRING) {
				stringstream temp;
				memcpy(buf, p, sizeof(string));
				temp << buf;
				temp >> Node.k[i];
			}
			else {
				memcpy(reinterpret_cast<char*>(&Node.k[i]), p, sizeof(K));
			}
		}
		p += sizeof(K);
	}
	if (Node.NodeState == LEAF) {
		for (i = 0; i < N - 1; i++) {
			memcpy(reinterpret_cast<char*>(&Node.p[i].BlockNum), p, sizeof(int));
			p += sizeof(int);
		}
	}
	for (i = 0; i < N; i++) {
		memcpy(reinterpret_cast<char*>(&Node.p[i].FileOff), p, sizeof(int));
		p += sizeof(int);
	}
	memcpy(reinterpret_cast<char*>(&Node.parent.FileOff), p, sizeof(int));
}